

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepidexample.cpp
# Opt level: O0

float getAlpha(float xmin,float ymin,float xmax,float ymax,float size)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  float in_XMM0_Da;
  float fVar5;
  float fVar6;
  float fVar7;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  bool in4;
  bool in3;
  bool in2;
  bool in1;
  float in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  bVar1 = in_XMM0_Da * in_XMM0_Da + in_XMM1_Da * in_XMM1_Da < in_XMM4_Da * in_XMM4_Da;
  bVar2 = in_XMM2_Da * in_XMM2_Da + in_XMM1_Da * in_XMM1_Da < in_XMM4_Da * in_XMM4_Da;
  bVar3 = in_XMM0_Da * in_XMM0_Da + in_XMM3_Da * in_XMM3_Da < in_XMM4_Da * in_XMM4_Da;
  bVar4 = in_XMM0_Da * in_XMM0_Da + in_XMM3_Da * in_XMM3_Da < in_XMM4_Da * in_XMM4_Da;
  fVar7 = (float)CONCAT31(CONCAT21(CONCAT11(bVar1,bVar2),bVar3),bVar4);
  if ((((bVar1) && (bVar2)) && (bVar3)) && (bVar4)) {
    local_4 = (in_XMM2_Da - in_XMM0_Da) * (in_XMM3_Da - in_XMM1_Da);
  }
  else if (((bVar1) || (bVar2)) || ((bVar3 || (bVar4)))) {
    if ((0.001 <= in_XMM2_Da - in_XMM0_Da) || (0.001 <= in_XMM3_Da - in_XMM1_Da)) {
      fVar5 = getAlpha(in_XMM2_Da,in_XMM3_Da,in_XMM4_Da,fVar7,in_stack_ffffffffffffffe0);
      fVar6 = getAlpha(in_XMM2_Da,in_XMM3_Da,in_XMM4_Da,fVar7,in_stack_ffffffffffffffe0);
      local_4 = getAlpha(in_XMM2_Da,in_XMM3_Da,in_XMM4_Da,fVar7,in_stack_ffffffffffffffe0);
      local_4 = fVar5 + fVar6 + local_4;
      fVar7 = getAlpha(in_XMM2_Da,in_XMM3_Da,in_XMM4_Da,fVar7,local_4);
      local_4 = local_4 + fVar7;
    }
    else {
      local_4 = 0.0;
    }
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

float
getAlpha (float xmin, float ymin, float xmax, float ymax, float size)
{
    bool in1 = xmin * xmin + ymin * ymin < size * size;
    bool in2 = xmax * xmax + ymin * ymin < size * size;
    bool in3 = xmin * xmin + ymax * ymax < size * size;
    bool in4 = xmin * xmin + ymax * ymax < size * size;

    if (in1 && in2 && in3 && in4) { return (xmax - xmin) * (ymax - ymin); }
    if (!in1 && !in2 && !in3 && !in4) { return 0.f; }
    if (xmax - xmin < 0.001 && ymax - ymin < 0.001) { return 0.f; }
    return getAlpha (xmin, ymin, (xmin + xmax) / 2, (ymin + ymax) / 2, size) +
           getAlpha ((xmin + xmax) / 2, ymin, xmax, (ymin + ymax) / 2, size) +
           getAlpha (xmin, (ymin + ymax) / 2, (xmin + xmax) / 2, ymax, size) +
           getAlpha ((xmin + xmax) / 2, (ymin + ymax) / 2, xmax, ymax, size);
}